

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_> *
getPluckerCoord<float>
          (vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           *__return_storage_ptr__,
          pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *lPair)

{
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *pMVar1;
  EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *pEVar2;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *this;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *this_00;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *this_01;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_3c0 [56];
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_388 [56];
  undefined1 local_350 [8];
  Matrix<float,_6,_1,_0,_6,_1> l2;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_300 [60];
  DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_2c4 [8];
  Matrix<float,_6,_1,_0,_6,_1> l1;
  Matrix<float,_3,_1,_0,_3,_1> m2;
  Matrix<float,3,1,0,3,1> local_268 [8];
  Matrix<float,_3,_1,_0,_3,_1> p2;
  Matrix<float,_3,_1,_0,_3,_1> m1;
  Matrix<float,3,1,0,3,1> local_214 [8];
  Matrix<float,_3,_1,_0,_3,_1> p1;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_1d0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_198;
  Matrix<float,3,1,0,3,1> local_11c [8];
  Matrix<float,_3,_1,_0,_3,_1> dir2;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_d8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_a0;
  Matrix<float,3,1,0,3,1> local_24 [8];
  Matrix<float,_3,_1,_0,_3,_1> dir1;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  *lPair_local;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  *lines;
  
  dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._4_8_ =
       lPair;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)local_d8,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(lPair->first).second,3);
  pMVar1 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           + 1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pMVar1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)lPair,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_a0,local_d8,pMVar1);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
            (local_24,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                       *)&local_a0);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)local_1d0,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(lPair->second).second,3);
  pMVar1 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pMVar1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&lPair->second,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_198,local_1d0,pMVar1);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
            (local_11c,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_198);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_24);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_11c);
  pEVar2 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pEVar2,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)lPair,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (local_214,pEVar2);
  this = (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
         (p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1)
  ;
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (this,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_24);
  pEVar2 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pEVar2,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&lPair->second,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (local_268,pEVar2);
  this_00 = (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
            (l1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array +
            4);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (this_00,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_11c);
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_2c4);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_300,local_2c4,3);
  Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
            (local_300,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_24);
  this_01 = (Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)
            (l2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array +
            4);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>((Type *)this_01,local_2c4,3);
  Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
            (this_01,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this);
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_350);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)local_388,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_350,3);
  Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
            (local_388,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_11c);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)local_3c0,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_350,3);
  Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
            (local_3c0,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_00);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_2c4);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_350);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 6,1>> getPluckerCoord(std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> lPair){

	// get line normalized direction
	Eigen::Matrix<floatPrec,3,1> dir1 = lPair.first.second.head(3) - lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lPair.second.second.head(3) - lPair.second.first.head(3);
	dir1.normalize();
	dir2.normalize();
	// get moment vectors
	Eigen::Matrix<floatPrec,3,1> p1 = lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m1 = dir1.cross(p1);
	Eigen::Matrix<floatPrec,3,1> p2 = lPair.second.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m2 = dir2.cross(p2);
	// get plucker coordinates
	Eigen::Matrix<floatPrec,6,1> l1;
	l1.head(3) = dir1; l1.tail(3) = m1;
	Eigen::Matrix<floatPrec,6,1> l2;
	l2.head(3) = dir2; l2.tail(3) = m2;

	vector<Matrix<floatPrec, 6,1>> lines;
	lines.push_back(l1); lines.push_back(l2);

	return lines;
}